

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall Js::PathTypeHandlerBase::DumpFixedFields(PathTypeHandlerBase *this)

{
  byte bVar1;
  ushort uVar2;
  TypePath *pTVar3;
  bool bVar4;
  bool bVar5;
  PropertyRecord *pPVar6;
  uint uVar7;
  
  uVar2 = (this->super_DynamicTypeHandler).unusedBytes;
  if (DAT_015d6361 == '\0') {
    if (1 < uVar2) {
      uVar7 = 0;
      do {
        pPVar6 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,uVar7);
        Output::Print(L" %s %d%d%d,",pPVar6 + 1,1,0,0);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (this->super_DynamicTypeHandler).unusedBytes >> 1);
    }
  }
  else if (1 < uVar2) {
    uVar7 = 0;
    do {
      pTVar3 = (this->typePath).ptr;
      if (uVar7 < ((pTVar3->data).ptr)->pathLength) {
        pPVar6 = TypePath::GetPropertyIdUnchecked(pTVar3,uVar7);
      }
      else {
        pPVar6 = (PropertyRecord *)0x0;
      }
      pTVar3 = (this->typePath).ptr;
      bVar1 = ((pTVar3->data).ptr)->maxInitializedLength;
      bVar4 = TypePath::GetIsFixedFieldAt
                        (pTVar3,(PropertyIndex)uVar7,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      bVar5 = TypePath::GetIsUsedFixedFieldAt
                        ((this->typePath).ptr,(PropertyIndex)uVar7,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      Output::Print(L" %s %d%d%d,",pPVar6 + 1,(ulong)(uVar7 < bVar1),(ulong)bVar4,(ulong)bVar5);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->super_DynamicTypeHandler).unusedBytes >> 1);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::DumpFixedFields() const {
        if (FixPropsOnPathTypes())
        {
            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetTypePath()->GetPropertyId(i)->GetBuffer(),
                    i < this->GetTypePath()->GetMaxInitializedLength() ? 1 : 0,
                    this->GetTypePath()->GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    this->GetTypePath()->GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }
        }
        else
        {
            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetTypePath()->GetPropertyId(i)->GetBuffer(), 1, 0, 0);
            }
        }
    }